

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall StringViewTest_Compare_Test::TestBody(StringViewTest_Compare_Test *this)

{
  basic_string_view<char> other;
  basic_string_view<char> other_00;
  basic_string_view<char> other_01;
  basic_string_view<char> other_02;
  basic_string_view<char> other_03;
  bool bVar1;
  undefined1 uVar2;
  AssertHelper *this_00;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  char *in_stack_fffffffffffffda8;
  basic_string_view<char> *in_stack_fffffffffffffdb0;
  int *in_stack_fffffffffffffdb8;
  char *in_stack_fffffffffffffdc0;
  AssertionResult *this_01;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  int line;
  basic_string_view<char> *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  Type in_stack_fffffffffffffddc;
  char *pcVar3;
  AssertHelper *in_stack_fffffffffffffde0;
  AssertionResult *this_02;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  AssertHelper *in_stack_fffffffffffffe30;
  int *in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  char *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  AssertionResult local_168 [2];
  undefined4 local_144;
  char local_130 [20];
  int local_11c;
  AssertionResult local_118 [2];
  undefined4 local_f4;
  int local_cc;
  AssertionResult local_c8 [2];
  undefined4 local_a4;
  int local_7c;
  AssertionResult local_78 [3];
  undefined4 local_44;
  int local_1c;
  AssertionResult local_18;
  
  fmt::v5::basic_string_view<char>::basic_string_view
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  fmt::v5::basic_string_view<char>::basic_string_view
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  other.data_._4_4_ = in_stack_fffffffffffffddc;
  other.data_._0_4_ = in_stack_fffffffffffffdd8;
  other.size_ = (size_t)in_stack_fffffffffffffde0;
  local_1c = fmt::v5::basic_string_view<char>::compare(in_stack_fffffffffffffdd0,other);
  local_44 = 0;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
             in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(int *)in_stack_fffffffffffffdb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffde0);
    in_stack_fffffffffffffe30 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1229f7);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,(char *)in_stack_fffffffffffffdd0
               ,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffe30,
               (Message *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdb0);
    testing::Message::~Message((Message *)0x122a5a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x122ab2);
  fmt::v5::basic_string_view<char>::basic_string_view
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  fmt::v5::basic_string_view<char>::basic_string_view
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  other_00.data_._4_4_ = in_stack_fffffffffffffddc;
  other_00.data_._0_4_ = in_stack_fffffffffffffdd8;
  other_00.size_ = (size_t)in_stack_fffffffffffffde0;
  local_7c = fmt::v5::basic_string_view<char>::compare(in_stack_fffffffffffffdd0,other_00);
  local_a4 = 0;
  testing::internal::CmpHelperGT<int,int>
            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe60);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_78);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffde0);
    testing::AssertionResult::failure_message((AssertionResult *)0x122ba7);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,(char *)in_stack_fffffffffffffdd0
               ,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffe30,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffe28));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdb0);
    testing::Message::~Message((Message *)0x122c04);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x122c5c);
  fmt::v5::basic_string_view<char>::basic_string_view
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  fmt::v5::basic_string_view<char>::basic_string_view
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  other_01.data_._4_4_ = in_stack_fffffffffffffddc;
  other_01.data_._0_4_ = in_stack_fffffffffffffdd8;
  other_01.size_ = (size_t)in_stack_fffffffffffffde0;
  local_cc = fmt::v5::basic_string_view<char>::compare(in_stack_fffffffffffffdd0,other_01);
  local_f4 = 0;
  testing::internal::CmpHelperLT<int,int>
            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffde0);
    testing::AssertionResult::failure_message((AssertionResult *)0x122d4b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,(char *)in_stack_fffffffffffffdd0
               ,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffe30,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffe28));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdb0);
    testing::Message::~Message((Message *)0x122da8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x122e00);
  pcVar3 = local_130;
  fmt::v5::basic_string_view<char>::basic_string_view
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  fmt::v5::basic_string_view<char>::basic_string_view
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  other_02.size_ = (size_t)in_stack_fffffffffffffde0;
  other_02.data_ = pcVar3;
  local_11c = fmt::v5::basic_string_view<char>::compare(in_stack_fffffffffffffdd0,other_02);
  local_144 = 0;
  this_02 = local_118;
  testing::internal::CmpHelperGT<int,int>
            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    in_stack_fffffffffffffdd0 =
         (basic_string_view<char> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x122eef);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)pcVar3 >> 0x20),
               (char *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc0
              );
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffe30,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffe28));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdb0);
    testing::Message::~Message((Message *)0x122f4c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x122fa4);
  fmt::v5::basic_string_view<char>::basic_string_view
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  fmt::v5::basic_string_view<char>::basic_string_view
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  other_03.size_ = (size_t)this_02;
  other_03.data_ = pcVar3;
  fmt::v5::basic_string_view<char>::compare(in_stack_fffffffffffffdd0,other_03);
  this_01 = local_168;
  testing::internal::CmpHelperLT<int,int>
            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             (int *)(ulong)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdcc);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x123093)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)pcVar3 >> 0x20),
               (char *)in_stack_fffffffffffffdd0,line,&this_01->success_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffe30,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffe28));
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x1230f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x123145);
  check_op<std::equal_to>();
  check_op<std::not_equal_to>();
  check_op<std::less>();
  check_op<std::less_equal>();
  check_op<std::greater>();
  check_op<std::greater_equal>();
  return;
}

Assistant:

TEST(StringViewTest, Compare) {
  EXPECT_EQ(string_view("foo").compare(string_view("foo")), 0);
  EXPECT_GT(string_view("fop").compare(string_view("foo")), 0);
  EXPECT_LT(string_view("foo").compare(string_view("fop")), 0);
  EXPECT_GT(string_view("foo").compare(string_view("fo")), 0);
  EXPECT_LT(string_view("fo").compare(string_view("foo")), 0);
  check_op<std::equal_to>();
  check_op<std::not_equal_to>();
  check_op<std::less>();
  check_op<std::less_equal>();
  check_op<std::greater>();
  check_op<std::greater_equal>();
}